

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

ALLEGRO_BITMAP * al_get_target_bitmap(void)

{
  thread_local_state *ptVar1;
  thread_local_state *tls;
  ALLEGRO_BITMAP *local_8;
  
  ptVar1 = tls_get();
  if (ptVar1 == (thread_local_state *)0x0) {
    local_8 = (ALLEGRO_BITMAP *)0x0;
  }
  else {
    local_8 = ptVar1->target_bitmap;
  }
  return local_8;
}

Assistant:

ALLEGRO_BITMAP *al_get_target_bitmap(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return 0;
   return tls->target_bitmap;
}